

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

bool __thiscall chatra::Thread::assignmentOperator(Thread *this)

{
  pointer *ppuVar1;
  Frame *this_00;
  pointer *pppVar2;
  pointer puVar3;
  Type TVar4;
  int iVar5;
  pointer pFVar6;
  Node *pNVar7;
  pointer ppTVar8;
  Tuple *pTVar9;
  ReferenceNode *pRVar10;
  Object *pOVar11;
  pointer pRVar12;
  pointer pRVar13;
  TemporaryObject *pTVar14;
  Requester RVar15;
  long *plVar16;
  size_t *psVar17;
  bool bVar18;
  EvaluateValueResult EVar19;
  Method *pMVar20;
  Class *pCVar21;
  Key *pKVar22;
  const_iterator cVar23;
  undefined1 auVar24 [8];
  const_iterator __first;
  unsigned_long *puVar25;
  TemporaryObject *pTVar26;
  undefined8 *puVar27;
  Reference RVar28;
  Array *this_01;
  Dict *this_02;
  long lVar29;
  pointer puVar30;
  size_t i;
  unsigned_long uVar31;
  const_iterator __end5;
  ulong uVar32;
  size_t sVar33;
  unsigned_long *puVar34;
  pointer_____offset_0x10___ *ppuVar35;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_03;
  long lVar36;
  size_t i_2;
  ulong uVar37;
  ulong uVar38;
  const_iterator __begin5;
  pointer ppVar39;
  long *plVar40;
  size_t *psVar41;
  ArgumentSpec arg;
  ArgumentSpec arg_00;
  unsigned_long uStack_220;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_218;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_200;
  string local_1e8;
  unsigned_long local_1c8;
  size_t destIndex;
  undefined1 auStack_1b8 [8];
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  map;
  anon_class_8_1_ba1d60bc local_198;
  anon_class_8_1_ba1d60bc local_190;
  Object *local_188;
  ArgumentMatcher local_180;
  undefined1 local_f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> srcIndexes;
  Reference RStack_d8;
  Reference ref;
  undefined1 local_b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> destIndexes;
  Reference RStack_88;
  Reference srcRef;
  unsigned_long local_70;
  size_t srcIndex;
  vector<unsigned_long,_std::allocator<unsigned_long>_> empty;
  
  pFVar6 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pFVar6 + -1;
  ppVar39 = pFVar6[-1].stack.
            super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pNVar7 = ppVar39[-1].first;
  uVar38 = ppVar39[-1].second;
  if (0x14 < uVar38) {
    if (uVar38 == 0x1e) {
      pFVar6[-1].stack.
      super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar39 + -1;
LAB_00156dcf:
      methodCallViaFunctionObject(this,true,(Method *)0x0);
      return false;
    }
switchD_00156da8_caseD_4:
    if (0x27 < uVar38) {
      ppTVar8 = pFVar6[-1].values.
                super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar31 = pFVar6[-1].subStack.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1];
      destIndex = (size_t)((ppTVar8[uVar31 - 2]->targetRef).node)->object;
      pTVar9 = (Tuple *)((ppTVar8[uVar31 - 1]->targetRef).node)->object;
      local_188 = ((ppTVar8[uVar31]->targetRef).node)->object;
      uVar37 = uVar38 - 0x28;
      uVar32 = uVar37 >> 2;
      destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)ppVar39;
      switch((uint)uVar38 & 3) {
      case 1:
        goto switchD_00156e68_caseD_1;
      case 2:
        goto switchD_00156e68_caseD_2;
      case 3:
        goto switchD_00156e68_caseD_3;
      }
      do {
        RVar15 = local_188[1].super_Lockable.lockRequester._M_i;
        if ((ulong)((long)(*(long *)&local_188[1].super_Lockable.lockCount - RVar15) / 0x28) <=
            uVar32) {
          Frame::popTemporaryTuple(this_00);
          Frame::pop(this_00);
          Frame::pop(this_00);
          Frame::pop(this_00);
          pTVar26 = Frame::pushTemporary(this_00);
          RVar28 = TemporaryObject::setRvalue(pTVar26);
          (RVar28.node)->type = Object;
          (RVar28.node)->object = (Object *)0x0;
          pppVar2 = &pFVar6[-1].stack.
                     super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar2 = *pppVar2 + -1;
          ppuVar1 = &pFVar6[-1].subStack.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + -1;
          return true;
        }
        lVar29 = uVar32 * 0x28;
        TemporaryTuple::extract((TemporaryTuple *)destIndex,*(size_t *)(RVar15 + lVar29));
        iVar5 = *(int *)(RVar15 + 0x20 + lVar29);
        if (iVar5 == 3) {
          pCVar21 = Dict::getClassStatic();
LAB_001579b9:
          if (pCVar21 != (Class *)0x0) {
            arg_00.cl = pCVar21;
            arg_00._0_8_ = 0xffffffffffffffff;
            TemporaryObject::addAssignment
                      (pFVar6[-1].values.
                       super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1],pNVar7,arg_00);
          }
        }
        else {
          if (iVar5 == 1) {
            pCVar21 = Array::getClassStatic();
            goto LAB_001579b9;
          }
          plVar40 = *(long **)(RVar15 + lVar29 + 8);
          if (plVar40 != *(long **)(RVar15 + lVar29 + 0x10)) {
            pCVar21 = getReferClass((pTVar9->super_ObjectBase).super_Object.refsArray.
                                    super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                    ._M_impl.super__Vector_impl_data._M_start[*plVar40].node);
            goto LAB_001579b9;
          }
        }
        ppVar39[-1].second = ppVar39[-1].second + 1;
switchD_00156e68_caseD_1:
        EVar19 = evaluateAndAllocateForAssignment
                           (this,(((pNVar7->subNodes).
                                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr,
                            pFVar6[-1].values.
                            super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1]);
        if (EVar19 != Next) {
          return false;
        }
switchD_00156e68_caseD_2:
        pTVar26 = pFVar6[-1].values.
                  super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1];
        TVar4 = pTVar26->type;
        if ((1 < TVar4 - ScopeRef) &&
           ((1 < TVar4 - FrameMethod ||
            (pMVar20 = TemporaryObject::getSetMethod(pTVar26), pMVar20 == (Method *)0x0)))) {
          pNVar7 = (((pNVar7->subNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string
                    ((string *)&local_180,"expression is not assignable",
                     (allocator *)&stack0xffffffffffffff78);
          srcIndex = 0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          errorAtNode(&this->super_IErrorReceiver,Error,pNVar7,(string *)&local_180,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&srcIndex);
          goto LAB_001578bc;
        }
        ppVar39[-1].second = ppVar39[-1].second + 1;
switchD_00156e68_caseD_3:
        RVar15 = local_188[1].super_Lockable.lockRequester._M_i;
        lVar29 = RVar15 + uVar32 * 0x28;
        pTVar26 = Frame::pushTemporary(this_00);
        RStack_88 = TemporaryObject::setRvalue(pTVar26);
        iVar5 = *(int *)(RVar15 + 0x20 + uVar32 * 0x28);
        if (iVar5 == 3) {
          this_02 = Reference::allocateWithoutLock<chatra::Dict>(&stack0xffffffffffffff78);
          psVar17 = *(size_t **)(lVar29 + 0x10);
          for (psVar41 = *(size_t **)(lVar29 + 8); psVar41 != psVar17; psVar41 = psVar41 + 1) {
            sVar33 = *psVar41;
            pKVar22 = Tuple::key(pTVar9,sVar33);
            if (pKVar22->sid == Invalid) {
              std::__cxx11::string::string((string *)&local_1e8,(string *)&pKVar22->str);
            }
            else {
              StringTable::ref_abi_cxx11_(&local_1e8,this->sTable,pKVar22->sid);
            }
            Dict::add(this_02,&local_1e8,
                      (pTVar9->super_ObjectBase).super_Object.refsArray.
                      super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                      _M_impl.super__Vector_impl_data._M_start[sVar33].node);
            std::__cxx11::string::~string((string *)&local_1e8);
          }
        }
        else if (iVar5 == 1) {
          this_01 = Reference::allocateWithoutLock<chatra::Array>(&stack0xffffffffffffff78);
          plVar16 = *(long **)(lVar29 + 0x10);
          for (plVar40 = *(long **)(lVar29 + 8); plVar40 != plVar16; plVar40 = plVar40 + 1) {
            Array::add(this_01,(pTVar9->super_ObjectBase).super_Object.refsArray.
                               super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                               ._M_impl.super__Vector_impl_data._M_start[*plVar40].node);
          }
        }
        else if (*(long **)(lVar29 + 8) == *(long **)(lVar29 + 0x10)) {
          (RStack_88.node)->type = Object;
          (RStack_88.node)->object = (Object *)0x0;
        }
        else {
          local_180.args.
          super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)(pTVar9->super_ObjectBase).super_Object.refsArray.
                        super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                        _M_impl.super__Vector_impl_data._M_start[**(long **)(lVar29 + 8)].node;
          Reference::setWithoutBothLock(&stack0xffffffffffffff78,(Reference *)&local_180);
        }
        pTVar26 = pFVar6[-1].values.
                  super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-2];
        bVar18 = TemporaryObject::hasRef(pTVar26);
        if (!bVar18) {
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage[-1] = (uVar37 & 0xfffffffffffffffc) + 0x2c;
          goto LAB_00157923;
        }
        bVar18 = lockReference(this,pTVar26);
        ppVar39 = (pointer)destIndexes.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage;
        if (!bVar18) {
          return false;
        }
        RStack_d8.node = (pTVar26->targetRef).node;
        if ((RStack_d8.node)->group->isConst == true) {
          pNVar7 = (((pNVar7->subNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string
                    ((string *)&local_180,"cannot modify constant reference",(allocator *)local_f8);
          srcIndex = 0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          errorAtNode(&this->super_IErrorReceiver,Error,pNVar7,(string *)&local_180,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&srcIndex);
          goto LAB_001578bc;
        }
        if ((pTVar26->hasArgs == true) &&
           (pCVar21 = getReferClass(RStack_d8),
           pCVar21 == (Class *)PreDefined<chatra::FunctionObject,(chatra::StringId)159>::pdCl)) {
          *(ulong *)((long)ppVar39 + -8) = (uVar37 & 0xfffffffffffffffc) + 0x2c;
          goto LAB_00156dcf;
        }
        Reference::setWithoutBothLock(&stack0xffffffffffffff28,&stack0xffffffffffffff78);
        Frame::pop(this_00);
        Frame::pop(this_00);
        *(ulong *)((long)ppVar39 + -8) = (uVar37 & 0xfffffffffffffffc) + 0x2c;
        uVar37 = (uVar37 & 0xfffffffffffffffc) + 4;
        uVar32 = uVar37 >> 2;
      } while( true );
    }
    puVar27 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar27 = &PTR__exception_0023db80;
    ppuVar35 = &InternalError::typeinfo;
    goto LAB_001578ad;
  }
  switch(uVar38) {
  case 0:
    ppVar39[-1].second = 1;
    local_180.args.super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(((pNVar7->subNodes).
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    goto LAB_001570a5;
  case 1:
    ppVar39[-1].second = 2;
    local_180.args.super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)(pNVar7->subNodes).
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_001570a5:
    srcIndex = srcIndex & 0xffffffff00000000;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)&pFVar6[-1].stack,(Node **)&local_180,(int *)&srcIndex);
    return true;
  case 2:
    goto switchD_00156da8_caseD_2;
  case 3:
    goto switchD_00156da8_caseD_3;
  default:
    goto switchD_00156da8_caseD_4;
  case 6:
    goto switchD_00156da8_caseD_6;
  case 7:
    goto switchD_00156da8_caseD_7;
  case 8:
    goto switchD_00156da8_caseD_8;
  case 10:
    ppTVar8 = pFVar6[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pTVar26 = ppTVar8[-2];
    pTVar14 = ppTVar8[-1];
    bVar18 = lockReference(this,pTVar26);
    if (!bVar18) {
      return false;
    }
    RStack_88.node = (pTVar26->targetRef).node;
    if ((RStack_88.node)->group->isConst != true) {
      if ((pTVar26->hasArgs == true) &&
         (pCVar21 = getReferClass(RStack_88),
         pCVar21 == (Class *)PreDefined<chatra::FunctionObject,(chatra::StringId)159>::pdCl)) {
        ppVar39[-1].second = 0x1e;
        return true;
      }
      local_180.args.super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(pTVar14->targetRef).node;
      Reference::setWithoutBothLock(&stack0xffffffffffffff78,(Reference *)&local_180);
      Frame::pop(this_00);
      pppVar2 = &pFVar6[-1].stack.
                 super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar2 = *pppVar2 + -1;
      return true;
    }
    pNVar7 = (((pNVar7->subNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string
              ((string *)&local_180,"cannot modify constant reference",
               (allocator *)&stack0xffffffffffffff28);
    srcIndex = 0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errorAtNode(&this->super_IErrorReceiver,Error,pNVar7,(string *)&local_180,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&srcIndex);
    goto LAB_001578bc;
  case 0x14:
    pFVar6[-1].stack.
    super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar39 + -1;
LAB_00157923:
    methodCall(this,true);
    return false;
  }
code_r0x001573fc:
  if (local_180.hasListVarArg == true) {
    local_218._M_impl.super__Vector_impl_data._M_start = (pointer)RStack_88.node;
    local_218._M_impl.super__Vector_impl_data._M_finish = (pointer)srcRef.node;
    local_218._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RStack_88.node = (ReferenceNode *)0x0;
    srcRef.node = (ReferenceNode *)0x0;
    assignmentOperator::anon_class_8_1_ba1d60bc::operator()
              (&local_190,local_180.listCount,
               (ArgumentDef *)
               ((long)&(local_180.args.
                        super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                        ._M_impl.super__Vector_impl_data._M_start)->type +
               local_180.listCount * 3 * 8),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_218);
  }
  if (local_180.hasDictVarArg == true) {
    local_200._M_impl.super__Vector_impl_data._M_start = (pointer)RStack_d8.node;
    local_200._M_impl.super__Vector_impl_data._M_finish = (pointer)ref.node;
    local_200._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RStack_d8.node = (ReferenceNode *)0x0;
    ref.node = (ReferenceNode *)0x0;
    assignmentOperator::anon_class_8_1_ba1d60bc::operator()
              (&local_190,
               ((long)local_180.args.
                      super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_180.args.
                     super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18 - 1,
               local_180.args.
               super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>._M_impl
               .super__Vector_impl_data._M_finish + -1,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_200);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_200);
  }
  lVar29 = (long)destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start - (long)local_b8;
  auVar24 = local_b8;
  for (lVar36 = lVar29 >> 5; 0 < lVar36; lVar36 = lVar36 + -1) {
    __first._M_current = (unsigned_long *)auVar24;
    if (*(unsigned_long *)auVar24 == 0xffffffffffffffff) goto LAB_00157557;
    if (*(unsigned_long *)((long)auVar24 + 8) == 0xffffffffffffffff) {
      __first._M_current = (unsigned_long *)((long)auVar24 + 8);
      goto LAB_00157557;
    }
    if (*(unsigned_long *)((long)auVar24 + 0x10) == 0xffffffffffffffff) {
      __first._M_current = (unsigned_long *)((long)auVar24 + 0x10);
      goto LAB_00157557;
    }
    if (*(unsigned_long *)((long)auVar24 + 0x18) == 0xffffffffffffffff) {
      __first._M_current = (unsigned_long *)((long)auVar24 + 0x18);
      goto LAB_00157557;
    }
    auVar24 = (undefined1  [8])((long)auVar24 + 0x20);
    lVar29 = lVar29 + -0x20;
  }
  lVar29 = lVar29 >> 3;
  if (lVar29 == 1) {
LAB_0015753d:
    __first._M_current = (unsigned_long *)auVar24;
    if (*(unsigned_long *)auVar24 != 0xffffffffffffffff) {
      __first._M_current =
           destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
  }
  else if (lVar29 == 2) {
LAB_00157533:
    __first._M_current = (unsigned_long *)auVar24;
    if (*(unsigned_long *)auVar24 != 0xffffffffffffffff) {
      auVar24 = (undefined1  [8])((long)auVar24 + 8);
      goto LAB_0015753d;
    }
  }
  else {
    __first._M_current =
         destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (lVar29 != 3) goto LAB_00157585;
    __first._M_current = (unsigned_long *)auVar24;
    if (*(unsigned_long *)auVar24 != 0xffffffffffffffff) {
      auVar24 = (undefined1  [8])((long)auVar24 + 8);
      goto LAB_00157533;
    }
  }
LAB_00157557:
  puVar34 = __first._M_current;
  if (__first._M_current !=
      destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    while (puVar25 = __first._M_current + 1, __first._M_current = puVar34,
          puVar25 !=
          destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
      __first._M_current = puVar25;
      if (*puVar25 != 0xffffffffffffffff) {
        *puVar34 = *puVar25;
        puVar34 = puVar34 + 1;
      }
    }
  }
LAB_00157585:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,__first,
             (const_iterator)
             destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_b8 !=
      (undefined1  [8])
      destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    srcIndex = 0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    for (auVar24 = local_b8;
        auVar24 !=
        (undefined1  [8])
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start; auVar24 = (undefined1  [8])((long)auVar24 + 8)) {
      local_1c8 = *(unsigned_long *)auVar24;
      srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      std::
      vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
      ::
      emplace_back<unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,chatra::ArgumentDef::Type>
                ((vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>
                  *)auStack_1b8,&local_1c8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&srcIndex,
                 (Type *)((long)&srcIndexes.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&srcIndex);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff28
            );
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff78
            );
  ArgumentMatcher::~ArgumentMatcher(&local_180);
  local_180.args.super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)pFVar6[-1].values.
                       super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pFVar6[-1].values.
                       super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&pFVar6[-1].subStack,(unsigned_long *)&local_180);
  pTVar26 = Frame::pushTemporary(this_00);
  puVar3 = destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_180.args.super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)TemporaryObject::setRvalue(pTVar26);
  Reference::
  allocateWithoutLock<chatra::TupleAssignmentMap,std::vector<chatra::TupleAssignmentMap::Element,std::allocator<chatra::TupleAssignmentMap::Element>>>
            ((Reference *)&local_180,
             (vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
              *)auStack_1b8);
  puVar3[-1] = 0x28;
  std::
  vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
  ::~vector((vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
             *)auStack_1b8);
  return true;
switchD_00156da8_caseD_2:
  EVar19 = evaluateValue(this,Value);
  if (EVar19 == Suspend) {
    return false;
  }
  if (EVar19 == StackChanged) {
    return true;
  }
switchD_00156da8_caseD_3:
  ppVar39[-1].second = 6;
switchD_00156da8_caseD_6:
  ppTVar8 = pFVar6[-1].values.
            super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pTVar26 = ppTVar8[-2];
  pTVar14 = ppTVar8[-1];
  if (pTVar26->type == Rvalue) {
    pCVar21 = getReferClass((pTVar26->targetRef).node);
    bVar18 = pCVar21 == (Class *)PreDefined<chatra::TemporaryTuple,(chatra::StringId)157>::pdCl;
  }
  else {
    bVar18 = false;
  }
  pCVar21 = getReferClass((pTVar14->targetRef).node);
  if ((bVar18) || (pCVar21 != (Class *)PreDefined<chatra::Tuple,(chatra::StringId)156>::pdCl)) {
    if (!bVar18) goto LAB_0015700b;
    if (pCVar21 == (Class *)PreDefined<chatra::Tuple,(chatra::StringId)156>::pdCl) {
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_1b8 = (undefined1  [8])0x0;
      map.
      super__Vector_base<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      TemporaryTuple::toArgumentMatcher
                (&local_180,(TemporaryTuple *)((pTVar26->targetRef).node)->object);
      pTVar9 = (Tuple *)((pTVar14->targetRef).node)->object;
      local_198.map =
           (vector<chatra::TupleAssignmentMap::Element,_std::allocator<chatra::TupleAssignmentMap::Element>_>
            *)auStack_1b8;
      RStack_88.node = (ReferenceNode *)0x0;
      srcRef.node = (ReferenceNode *)0x0;
      RStack_d8.node = (ReferenceNode *)0x0;
      ref.node = (ReferenceNode *)0x0;
      local_190.map = local_198.map;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f8,
                 (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                       super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                       super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&srcIndex);
      pRVar12 = (pTVar9->super_ObjectBase).super_Object.refsArray.
                super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                super__Vector_impl_data._M_finish;
      pRVar13 = (pTVar9->super_ObjectBase).super_Object.refsArray.
                super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (uVar31 = 0; (long)pRVar12 - (long)pRVar13 >> 3 != uVar31; uVar31 = uVar31 + 1) {
        *(unsigned_long *)((long)local_f8 + uVar31 * 8) = uVar31;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b8,
                 ((long)local_180.args.
                        super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_180.args.
                       super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&srcIndex
                );
      for (uVar31 = 0;
          ((long)local_180.args.
                 super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)local_180.args.
                super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x18 != uVar31; uVar31 = uVar31 + 1) {
        *(unsigned_long *)((long)local_b8 + uVar31 * 8) = uVar31;
      }
      if (local_180.hasListVarArg != false) {
        *(unsigned_long *)((long)local_b8 + local_180.listCount * 8) = 0xffffffffffffffff;
      }
      if (local_180.hasDictVarArg == true) {
        destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[-1] = 0xffffffffffffffff;
      }
      destIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)ppVar39;
      for (uVar38 = 0;
          uVar38 < (ulong)((long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                                 super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                                 super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar38 = uVar38 + 1) {
        pKVar22 = Tuple::key(pTVar9,uVar38);
        if ((pKVar22->sid != Invalid) &&
           (cVar23 = std::
                     _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_unsigned_long>,_std::allocator<std::pair<const_chatra::StringId,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&local_180.byName._M_h,&pKVar22->sid),
           cVar23.super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
           ._M_cur != (__node_type *)0x0)) {
          assignmentOperator::anon_class_8_1_ba1d60bc::operator()
                    (&local_198,
                     *(size_t *)
                      ((long)cVar23.
                             super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                             ._M_cur + 0x10),
                     (ArgumentDef *)
                     ((long)&(local_180.args.
                              super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                              ._M_impl.super__Vector_impl_data._M_start)->type +
                     *(size_t *)
                      ((long)cVar23.
                             super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                             ._M_cur + 0x10) * 3 * 8),uVar38);
          *(unsigned_long *)((long)local_f8 + uVar38 * 8) = 0xffffffffffffffff;
          *(unsigned_long *)
           ((long)local_b8 +
           *(long *)((long)cVar23.
                           super__Node_iterator_base<std::pair<const_chatra::StringId,_unsigned_long>,_false>
                           ._M_cur + 0x10) * 8) = 0xffffffffffffffff;
        }
      }
      local_70 = 0;
      sVar33 = 0;
      for (uVar38 = 0; uVar38 < local_180.listCount; uVar38 = uVar38 + 1) {
        if (*(unsigned_long *)((long)local_b8 + uVar38 * 8) != 0xffffffffffffffff) {
          puVar3 = (pointer)((long)local_f8 + sVar33 * 8);
          lVar36 = 0;
          for (lVar29 = (long)srcIndexes.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)puVar3 >> 5;
              0 < lVar29; lVar29 = lVar29 + -1) {
            if (*(long *)((long)puVar3 + lVar36) != -1) {
              puVar30 = (pointer)((long)puVar3 + lVar36);
              goto LAB_0015733e;
            }
            if (*(long *)((long)puVar3 + lVar36 + 8) != -1) {
              puVar30 = (pointer)((long)puVar3 + lVar36 + 8);
              goto LAB_0015733e;
            }
            if (*(long *)((long)puVar3 + lVar36 + 0x10) != -1) {
              puVar30 = (pointer)((long)puVar3 + lVar36 + 0x10);
              goto LAB_0015733e;
            }
            if (*(long *)((long)puVar3 + lVar36 + 0x18) != -1) {
              puVar30 = (pointer)((long)puVar3 + lVar36 + 0x18);
              goto LAB_0015733e;
            }
            lVar36 = lVar36 + 0x20;
          }
          lVar29 = ((long)srcIndexes.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)puVar3) - lVar36 >> 3;
          puVar30 = (pointer)((long)puVar3 + lVar36);
          if (lVar29 == 1) {
LAB_00157336:
            if (*puVar30 == 0xffffffffffffffff) {
              puVar30 = srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
          }
          else if (lVar29 == 3) {
            if (*puVar30 == 0xffffffffffffffff) {
              puVar30 = (pointer)((long)puVar3 + lVar36 + 8);
              goto LAB_0015732c;
            }
          }
          else {
            if (lVar29 != 2) break;
LAB_0015732c:
            if (*puVar30 == 0xffffffffffffffff) {
              puVar30 = puVar30 + 1;
              goto LAB_00157336;
            }
          }
LAB_0015733e:
          if (puVar30 ==
              srcIndexes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start) break;
          local_70 = (long)puVar30 - (long)local_f8 >> 3;
          assignmentOperator::anon_class_8_1_ba1d60bc::operator()
                    (&local_198,uVar38,
                     (ArgumentDef *)
                     ((long)&(local_180.args.
                              super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>
                              ._M_impl.super__Vector_impl_data._M_start)->type + uVar38 * 3 * 8),
                     local_70);
          *(unsigned_long *)((long)local_f8 + local_70 * 8) = 0xffffffffffffffff;
          *(unsigned_long *)((long)local_b8 + uVar38 * 8) = 0xffffffffffffffff;
          sVar33 = local_70 + 1;
          local_70 = sVar33;
        }
      }
      do {
        if ((ulong)((long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                          super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pTVar9->super_ObjectBase).super_Object.refsArray.
                          super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) <= sVar33)
        goto code_r0x001573fc;
        if (*(pointer)((long)local_f8 + sVar33 * 8) != 0xffffffffffffffff) {
          pKVar22 = Tuple::key(pTVar9,sVar33);
          if ((pKVar22->sid == Invalid) || (local_180.hasDictVarArg == false)) {
            if (local_180.hasListVarArg != true) goto LAB_001573da;
            this_03 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      &stack0xffffffffffffff78;
          }
          else {
            this_03 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                      &stack0xffffffffffffff28;
          }
          std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                    (this_03,&local_70);
        }
LAB_001573da:
        sVar33 = local_70 + 1;
        local_70 = sVar33;
      } while( true );
    }
    std::__cxx11::string::string
              ((string *)&local_180,"right side is not tuple",(allocator *)&stack0xffffffffffffff78)
    ;
    srcIndex = 0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errorAtNode(&this->super_IErrorReceiver,Error,pNVar7,(string *)&local_180,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&srcIndex);
  }
  else {
    pRVar10 = (pTVar14->targetRef).node;
    pOVar11 = pRVar10->object;
    pRVar12 = (pOVar11->refsArray).
              super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((long)(pOVar11->refsArray).
              super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pRVar12 == 8) {
      srcIndex = (size_t)pRVar12->node;
      local_180.args.super__Vector_base<chatra::ArgumentDef,_std::allocator<chatra::ArgumentDef>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)pRVar10;
      Reference::setWithoutBothLock((Reference *)&local_180,(Reference *)&srcIndex);
LAB_0015700b:
      pCVar21 = getReferClass((pTVar14->targetRef).node);
      arg.cl = pCVar21;
      arg._0_8_ = 0xffffffffffffffff;
      TemporaryObject::addAssignment(pTVar26,pNVar7,arg);
      ppVar39[-1].second = ppVar39[-1].second + 1;
switchD_00156da8_caseD_7:
      EVar19 = evaluateAndAllocateForAssignment
                         (this,(((pNVar7->subNodes).
                                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          pFVar6[-1].values.
                          super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-2]);
      if (EVar19 != Next) {
        return false;
      }
switchD_00156da8_caseD_8:
      pTVar26 = pFVar6[-1].values.
                super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-2];
      TVar4 = pTVar26->type;
      if (TVar4 - ScopeRef < 2) {
        uStack_220 = 10;
LAB_00157087:
        ppVar39[-1].second = uStack_220;
        return true;
      }
      if ((TVar4 - FrameMethod < 2) &&
         (pMVar20 = TemporaryObject::getSetMethod(pTVar26), pMVar20 != (Method *)0x0)) {
        uStack_220 = 0x14;
        goto LAB_00157087;
      }
      pNVar7 = (((pNVar7->subNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string
                ((string *)&local_180,"expression is not assignable",
                 (allocator *)&stack0xffffffffffffff78);
      srcIndex = 0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errorAtNode(&this->super_IErrorReceiver,Error,pNVar7,(string *)&local_180,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&srcIndex);
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_180,
                 "left side is not tuple even through value of right side is tuple",
                 (allocator *)&stack0xffffffffffffff78);
      srcIndex = 0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      empty.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      errorAtNode(&this->super_IErrorReceiver,Error,pNVar7,(string *)&local_180,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&srcIndex);
    }
  }
LAB_001578bc:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&srcIndex);
  std::__cxx11::string::~string((string *)&local_180);
  puVar27 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar27 = &PTR__exception_0023dab8;
  *(undefined4 *)(puVar27 + 1) = 0x83;
  ppuVar35 = &RuntimeException::typeinfo;
LAB_001578ad:
  __cxa_throw(puVar27,ppuVar35,std::exception::~exception);
}

Assistant:

bool Thread::assignmentOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	constexpr size_t phaseReference = 10;
	constexpr size_t phaseMethod = 20;
	constexpr size_t phaseFunctionObject = 30;
	constexpr size_t phaseTuple = 40;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case assignmentOperatorEvaluationPhase:  CHATRA_EVALUATE_VALUE;
	case assignmentOperatorEvaluationPhase + 1:  nodePhase = assignmentOperatorProcessPhase;  CHATRA_FALLTHROUGH;
	case assignmentOperatorProcessPhase: {
		// Note that node->subNode[1] cannot be accessed under specific situation
		// because following logic is also used by unaryAssignmentOperator().
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);

		// Tuple <- Tuple: accept
		// Scalar <- Tuple: accept only if Tuple contains a single value
		// Tuple <- Scalar: reject
		// Scaler <- Scalar: accept

		bool v0IsTuple = (v0->getType() == TemporaryObject::Type::Rvalue &&
				getReferClass(v0->getRef()) == TemporaryTuple::getClassStatic());
		bool v1IsTuple = (getReferClass(v1->getRef()) == Tuple::getClassStatic());

		if (!v0IsTuple && v1IsTuple) {
			auto& tuple = v1->getRef().deref<Tuple>();
			if (tuple.tupleSize() != 1) {
				errorAtNode(*this, ErrorLevel::Error, node, "left side is not tuple even through value of right side is tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}
			v1->getRef().set(tuple.ref(0));
			v1IsTuple = false;
		}

		if (v0IsTuple) {
			if (!v1IsTuple) {
				errorAtNode(*this, ErrorLevel::Error, node, "right side is not tuple", {});
				throw RuntimeException(StringId::UnsupportedOperationException);
			}

			std::vector<TupleAssignmentMap::Element> map;
			v0->getRef().deref<TemporaryTuple>().toArgumentMatcher().mapReturns(v1->getRef().deref<Tuple>(),
					[&](size_t destIndex, const ArgumentDef& arg, size_t srcIndex) {
						map.emplace_back(destIndex, srcIndex, arg.type);

					}, [&](size_t destIndex, const ArgumentDef& arg, std::vector<size_t> srcIndexes) {
						map.emplace_back(destIndex, std::move(srcIndexes), arg.type);

					}, [&](const std::vector<size_t>& destIndexes) {
						std::vector<size_t> empty;
						for (size_t destIndex : destIndexes)
							map.emplace_back(destIndex, empty, ArgumentDef::Type::List);
					});

			f.subStack.push_back(f.values.size());
			f.pushTemporary()->setRvalue().allocate<TupleAssignmentMap>(std::move(map));
			nodePhase = phaseTuple;
			return true;
		}

		v0->addAssignment(node, {StringId::Invalid, getReferClass(v1->getRef())});
		nodePhase++;
		CHATRA_FALLTHROUGH;
	}

	case assignmentOperatorProcessPhase + 1:
		if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), *(f.values.end() - 2)) != EvaluateValueResult::Next)
			return false;
		CHATRA_FALLTHROUGH;

	case assignmentOperatorProcessPhase + 2: {
		auto* v0 = *(f.values.end() - 2);
		switch (v0->getType()) {
		case TemporaryObject::Type::ScopeRef:
		case TemporaryObject::Type::ObjectRef:
			nodePhase = phaseReference;
			return true;

		case TemporaryObject::Type::FrameMethod:
		case TemporaryObject::Type::ObjectMethod:
			if (v0->getSetMethod() != nullptr) {
				nodePhase = phaseMethod;
				return true;
			}
			CHATRA_FALLTHROUGH;

		default:
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
	}

	case phaseReference: { // Reference; e.g. "a = 1", "b.c = 2"
		auto* v0 = *(f.values.end() - 2);
		auto* v1 = *(f.values.end() - 1);
		if (!lockReference(v0))
			return false;
		auto ref = v0->getRef();
		if (ref.isConst()) {
			errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
			throw RuntimeException(StringId::UnsupportedOperationException);
		}
		if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
			nodePhase = phaseFunctionObject;
			return true;
		}

		ref.set(v1->getRef());
		f.pop();
		f.stack.pop_back();
		return true;
	}

	case phaseMethod: {  // Method; e.g. "a.b(...) = 1" where a is an instance of some class and its class has a method "def b(...).set(r)"
		f.stack.pop_back();
		methodCall(true);
		return false;
	}

	case phaseFunctionObject: {
		f.stack.pop_back();
		methodCallViaFunctionObject(true);
		return false;
	}

	default: {
		if (nodePhase >= phaseTuple) {  // Tuple; e.g. "a, b = foo()"
			auto& tmp = f.values[f.subStack.back() - 2]->getRef().deref<TemporaryTuple>();
			auto& tuple = f.values[f.subStack.back() - 1]->getRef().deref<Tuple>();
			auto& map = f.values[f.subStack.back()]->getRef().deref<TupleAssignmentMap>();

			constexpr size_t phasesPerElem = 1U << 2U;  // = 4
			for (;;) {
				size_t phase = nodePhase - phaseTuple;
				size_t position = phase / phasesPerElem;
				size_t subPhase = phase % phasesPerElem;

				switch (subPhase) {
				case 0: {
					if (map.map.size() <= position) {
						f.popTemporaryTuple();
						f.pop();
						f.pop();
						f.pop();
						f.pushTemporary()->setRvalue().setNull();
						f.stack.pop_back();
						f.subStack.pop_back();
						return true;
					}
					auto& e = map.map[position];
					tmp.extract(e.destIndex);

					const Class* cl;
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg:  cl = Array::getClassStatic();  break;
					case ArgumentDef::Type::DictVarArg:  cl = Dict::getClassStatic();  break;
					default:  cl = (e.sourceIndexes.empty() ? nullptr : getReferClass(tuple.ref(e.sourceIndexes[0])));  break;
					}
					if (cl != nullptr)
						f.values.back()->addAssignment(node, {StringId::Invalid, cl});
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				case 1:
					if (evaluateAndAllocateForAssignment(node->subNodes[0].get(), f.values.back()) != EvaluateValueResult::Next)
						return false;
					CHATRA_FALLTHROUGH;

				case 2: {
					auto* v0 = f.values.back();
					switch (v0->getType()) {
					case TemporaryObject::Type::ScopeRef:
					case TemporaryObject::Type::ObjectRef:
						break;

					case TemporaryObject::Type::FrameMethod:
					case TemporaryObject::Type::ObjectMethod:
						if (v0->getSetMethod() != nullptr)
							break;
						CHATRA_FALLTHROUGH;

					default:
						errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "expression is not assignable", {});
						throw RuntimeException(StringId::UnsupportedOperationException);
					}
					nodePhase++;
					CHATRA_FALLTHROUGH;
				}

				default: {
					auto& e = map.map[position];
					auto srcRef = f.pushTemporary()->setRvalue();
					switch (e.type) {
					case ArgumentDef::Type::ListVarArg: {
						auto& array = srcRef.allocate<Array>();
						for (size_t sourceIndex : e.sourceIndexes)
							array.add(tuple.ref(sourceIndex));
						break;
					}

					case ArgumentDef::Type::DictVarArg: {
						auto& dict = srcRef.allocate<Dict>();
						for (size_t sourceIndex : e.sourceIndexes) {
							auto& key = tuple.key(sourceIndex);
							dict.add(key.sid == StringId::Invalid ? key.str : sTable->ref(key.sid),
									tuple.ref(sourceIndex));
						}
						break;
					}

					default:
						if (e.sourceIndexes.empty())
							srcRef.setNull();
						else
							srcRef.set(tuple.ref(e.sourceIndexes[0]));
						break;
					}

					auto* v0 = *(f.values.end() - 2);
					if (v0->hasRef()) {
						if (!lockReference(v0))
							return false;
						auto ref = v0->getRef();
						if (ref.isConst()) {
							errorAtNode(*this, ErrorLevel::Error, node->subNodes[0].get(), "cannot modify constant reference", {});
							throw RuntimeException(StringId::UnsupportedOperationException);
						}
						if (v0->hasArguments() && getReferClass(ref) == FunctionObject::getClassStatic()) {
							nodePhase = phaseTuple + (position + 1) * phasesPerElem;
							methodCallViaFunctionObject(true);
							return false;
						}

						ref.set(srcRef);
						f.pop();
						f.pop();
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
					}
					else {
						nodePhase = phaseTuple + (position + 1) * phasesPerElem;
						methodCall(true);
						return false;
					}
				}
				}
			}
		}
		throw InternalError();
	}
	}
}